

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O3

void get_topology_cold_3(void)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  
  fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
  __stream = _stderr;
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  fprintf(__stream,"%s: %s\n","get_die_id: fclose",pcVar2);
  return;
}

Assistant:

static int get_die_id(uint32_t cpu, uint32_t* die) {
  char fname[92] = { 0 };
  struct stat ss;
  FILE* f;
  int fret;
  snprintf(fname, sizeof(fname), "/sys/devices/system/cpu/cpu%"PRIu32"/topology/die_id", cpu);
  // die_id does not exist on all systems, so check for it first
  if (stat(fname, &ss)) {
    raplcap_log(DEBUG, "get_die_id: %s: %s\n", fname, strerror(errno));
    *die = 0;
  } else {
    if ((f = fopen(fname, "r")) == NULL) {
      raplcap_perror(ERROR, fname);
      return -1;
    }
    fret = fscanf(f, "%"PRIu32, die);
    if (fclose(f)) {
      raplcap_perror(WARN, "get_die_id: fclose");
    }
    if (fret != 1) {
      raplcap_log(ERROR, "get_die_id: Failed to read die_id for cpu%"PRIu32"\n", cpu);
      errno = ENODATA;
      return -1;
    }
  }
  raplcap_log(DEBUG, "get_die_id: cpu=%"PRIu32", die=%"PRIu32"\n", cpu, *die);
  return 0;
}